

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O2

int Llb_ManReachMinCut(Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  long lVar4;
  Aig_Man_t *p;
  Vec_Ptr_t *vResult;
  abctime time;
  
  aVar2 = Abc_Clock();
  iVar1 = pPars->TimeLimit;
  if ((long)iVar1 == 0) {
    lVar4 = 0;
  }
  else {
    aVar3 = Abc_Clock();
    lVar4 = aVar3 + (long)iVar1 * 1000000;
  }
  pPars->TimeTarget = lVar4;
  p = Aig_ManDupFlopsOnly(pAig);
  if ((pPars->fVerbose != 0) && (Aig_ManPrintStats(pAig), pPars->fVerbose != 0)) {
    Aig_ManPrintStats(p);
  }
  Aig_ManFanoutStart(p);
  vResult = Llb_ManComputeCuts(p,pPars->nPartValue,pPars->fVerbose,pPars->fVeryVerbose);
  if ((pPars->TimeLimit == 0) || (aVar3 = Abc_Clock(), aVar3 <= pPars->TimeTarget)) {
    if (pPars->fSkipReach == 0) {
      iVar1 = Llb_CoreExperiment(pAig,p,pPars,vResult,pPars->TimeTarget);
    }
    else {
      iVar1 = -1;
    }
    Vec_VecFree((Vec_Vec_t *)vResult);
    Aig_ManFanoutStop(p);
    Aig_ManCleanMarkAB(p);
    Aig_ManStop(p);
    if (iVar1 != -1) {
      return iVar1;
    }
    aVar3 = Abc_Clock();
    Abc_PrintTime(0x81e045,(char *)(aVar3 - aVar2),time);
  }
  else {
    if (pPars->fSilent == 0) {
      printf("Reached timeout (%d seconds) after partitioning.\n",(ulong)(uint)pPars->TimeLimit);
    }
    Vec_VecFree((Vec_Vec_t *)vResult);
    Aig_ManFanoutStop(p);
    Aig_ManCleanMarkAB(p);
    Aig_ManStop(p);
  }
  return -1;
}

Assistant:

int Llb_ManReachMinCut( Aig_Man_t * pAig, Gia_ParLlb_t * pPars )
{
    extern Vec_Ptr_t * Llb_ManComputeCuts( Aig_Man_t * p, int Num, int fVerbose, int fVeryVerbose );
    Vec_Ptr_t * vResult;
    Aig_Man_t * p;
    int RetValue = -1;
    abctime clk = Abc_Clock();

    // compute time to stop
    pPars->TimeTarget = pPars->TimeLimit ? pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;

    p = Aig_ManDupFlopsOnly( pAig );
//Aig_ManShow( p, 0, NULL );
    if ( pPars->fVerbose )
    Aig_ManPrintStats( pAig );
    if ( pPars->fVerbose )
    Aig_ManPrintStats( p );
    Aig_ManFanoutStart( p );

    vResult = Llb_ManComputeCuts( p, pPars->nPartValue, pPars->fVerbose, pPars->fVeryVerbose );

    if ( pPars->TimeLimit && Abc_Clock() > pPars->TimeTarget )
    {
        if ( !pPars->fSilent )
            printf( "Reached timeout (%d seconds) after partitioning.\n", pPars->TimeLimit );

        Vec_VecFree( (Vec_Vec_t *)vResult );
        Aig_ManFanoutStop( p );
        Aig_ManCleanMarkAB( p );
        Aig_ManStop( p );
        return RetValue;
    }

    if ( !pPars->fSkipReach )
        RetValue = Llb_CoreExperiment( pAig, p, pPars, vResult, pPars->TimeTarget );

    Vec_VecFree( (Vec_Vec_t *)vResult );
    Aig_ManFanoutStop( p );
    Aig_ManCleanMarkAB( p );
    Aig_ManStop( p );

    if ( RetValue == -1 )
        Abc_PrintTime( 1, "Total runtime of the min-cut-based reachability engine", Abc_Clock() - clk );
    return RetValue;
}